

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveImports.cpp
# Opt level: O0

void __thiscall wasm::RemoveImports::RemoveImports(RemoveImports *this)

{
  RemoveImports *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__RemoveImports_0309f9a0;
  return;
}

Assistant:

void visitCall(Call* curr) {
    auto* func = getModule()->getFunction(curr->target);
    if (!func->imported()) {
      return;
    }
    Type type = func->getResults();
    if (type == Type::none) {
      replaceCurrent(getModule()->allocator.alloc<Nop>());
    } else {
      Literal nopLiteral(type);
      replaceCurrent(getModule()->allocator.alloc<Const>()->set(nopLiteral));
    }
  }